

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_decoder.hpp
# Opt level: O1

bool __thiscall
jsoncons::
json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>,_std::allocator<char>_>
::visit_byte_string(json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>,_std::allocator<char>_>
                    *this,byte_string_view *b,uint64_t ext_tag,ser_context *param_3,
                   error_code *param_4)

{
  structure_type sVar1;
  uint64_t local_28;
  anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_5
  local_20;
  
  sVar1 = (this->structure_stack_).
          super__Vector_base<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>,_std::allocator<char>_>::structure_info,_std::allocator<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>,_std::allocator<char>_>::structure_info>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].type_;
  local_28 = ext_tag;
  if (sVar1 - array_t < 2) {
    local_20._0_8_ = this->index_;
    this->index_ = local_20._0_8_ + 1;
    std::
    vector<jsoncons::index_key_value<jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>,std::pmr::polymorphic_allocator<jsoncons::index_key_value<jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>>>
    ::
    emplace_back<std::__cxx11::basic_string<char,std::char_traits<char>,std::pmr::polymorphic_allocator<char>>,unsigned_long,jsoncons::byte_string_arg_t_const&,jsoncons::byte_string_view_const&,unsigned_long&>
              ((vector<jsoncons::index_key_value<jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>,std::pmr::polymorphic_allocator<jsoncons::index_key_value<jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>>>
                *)&this->item_stack_,&this->name_,(unsigned_long *)&local_20,
               (byte_string_arg_t *)&byte_string_arg,b,&local_28);
  }
  else if (sVar1 == root_t) {
    local_20.long_str_.ptr_ =
         (pointer)utility::
                  heap_string_factory<unsigned_char,_unsigned_long,_std::pmr::polymorphic_allocator<char>_>
                  ::create(b->data_,b->size_,ext_tag,&this->allocator_);
    local_20.common_ = (common_storage)0x120c;
    basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>::operator=
              (&this->result_,
               (basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_> *)
               &local_20.common_);
    basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>::destroy
              ((basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_> *)
               &local_20.common_);
    this->is_valid_ = true;
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_byte_string(const byte_string_view& b, 
        uint64_t ext_tag, 
        const ser_context&,
        std::error_code&) override
    {
        switch (structure_stack_.back().type_)
        {
            case structure_type::object_t:
            case structure_type::array_t:
                item_stack_.emplace_back(std::move(name_), index_++, byte_string_arg, b, ext_tag);
                break;
            case structure_type::root_t:
                result_ = Json(byte_string_arg, b, ext_tag, allocator_);
                is_valid_ = true;
                JSONCONS_VISITOR_RETURN;
        }
        JSONCONS_VISITOR_RETURN;
    }